

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::LE_Fire_PDU::Decode(LE_Fire_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  anon_union_1_2_647d7bf6_for_m_FireFlagUnion *V;
  LE_EntityIdentifier *pLVar1;
  MunitionDescriptor *this_00;
  KUINT8 KVar2;
  byte bVar3;
  KUINT16 KVar4;
  KException *this_01;
  int iVar5;
  undefined7 in_register_00000011;
  KUINT16 tmp;
  KString local_50;
  
  KVar4 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (0x22 < iVar5 + (uint)KVar4) {
    LE_Header::Decode(&this->super_LE_Header,stream,ignoreHeader);
    V = &this->m_FireFlagUnion;
    KDataStream::Read(stream,&V->m_ui8Flag);
    bVar3 = (this->m_FireFlagUnion).m_ui8Flag;
    if ((bVar3 & 1) != 0) {
      (*(this->m_TargetID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_TargetID,stream);
      bVar3 = (this->m_FireFlagUnion).m_ui8Flag;
    }
    tmp = 0;
    if ((bVar3 & 4) != 0) {
      pLVar1 = &this->m_MunitionID;
      if ((bVar3 & 2) == 0) {
        KVar2 = (this->super_LE_Header).m_EntID.m_ui8ApplicationID;
        KVar4 = (this->super_LE_Header).m_EntID.m_ui16EntityID;
        (this->m_MunitionID).m_ui8SiteID = (this->super_LE_Header).m_EntID.m_ui8SiteID;
        (this->m_MunitionID).m_ui8ApplicationID = KVar2;
        (this->m_MunitionID).m_ui16EntityID = KVar4;
        KDataStream::Read<unsigned_short>(stream,&tmp);
        DATA_TYPE::LE_EntityIdentifier::SetEntityID(pLVar1,tmp);
      }
      else {
        (*(pLVar1->super_DataTypeBase)._vptr_DataTypeBase[3])(pLVar1,stream);
      }
    }
    pLVar1 = &this->m_EventID;
    if (((this->m_FireFlagUnion).m_ui8Flag & 8) == 0) {
      KVar2 = (this->super_LE_Header).m_EntID.m_ui8ApplicationID;
      KVar4 = (this->super_LE_Header).m_EntID.m_ui16EntityID;
      (this->m_EventID).m_ui8SiteID = (this->super_LE_Header).m_EntID.m_ui8SiteID;
      (this->m_EventID).m_ui8ApplicationID = KVar2;
      (this->m_EventID).m_ui16EntityID = KVar4;
      KDataStream::Read<unsigned_short>(stream,&tmp);
      DATA_TYPE::LE_EntityIdentifier::SetEntityID(pLVar1,tmp);
    }
    else {
      (*(pLVar1->super_DataTypeBase)._vptr_DataTypeBase[3])(pLVar1,stream);
    }
    if ((V->m_ui8Flag & 0x40) != 0) {
      (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Loc,stream);
    }
    this_00 = &this->m_MunitionDesc;
    DATA_TYPE::EntityType::EntityType((EntityType *)&local_50,stream);
    DATA_TYPE::Descriptor::SetType(&this_00->super_Descriptor,(EntityType *)&local_50);
    DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&local_50);
    bVar3 = V->m_ui8Flag;
    if ((bVar3 & 0x10) != 0) {
      KDataStream::Read<unsigned_short>(stream,&tmp);
      DATA_TYPE::MunitionDescriptor::SetWarhead(this_00,(uint)tmp);
      KDataStream::Read<unsigned_short>(stream,&tmp);
      DATA_TYPE::MunitionDescriptor::SetFuse(this_00,(uint)tmp);
      bVar3 = V->m_ui8Flag;
    }
    if ((bVar3 & 0x20) != 0) {
      KDataStream::Read<unsigned_short>(stream,&tmp);
      DATA_TYPE::MunitionDescriptor::SetQuantity(this_00,tmp);
      KDataStream::Read<unsigned_short>(stream,&tmp);
      DATA_TYPE::MunitionDescriptor::SetRate(this_00,tmp);
    }
    (*(this->m_Vel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Vel,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Range);
    return;
  }
  this_01 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Decode",(allocator<char> *)&tmp);
  KException::KException(this_01,&local_50,2);
  __cxa_throw(this_01,&KException::typeinfo,KException::~KException);
}

Assistant:

void LE_Fire_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < LE_FIRE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    LE_Header::Decode( stream, ignoreHeader );

    stream >> m_FireFlagUnion.m_ui8Flag;

    // F0: Target Entity ID
    if( m_FireFlagUnion.m_ui8TargetId )
    {
        stream >> KDIS_STREAM m_TargetID;
    }

    KUINT16 tmp = 0;

    // F2: Munition ID
    if( m_FireFlagUnion.m_ui8MunitionId )
    {
        // F1: Site Number and Application Number
        if( m_FireFlagUnion.m_ui8MunitionSiteApp )
        {
            stream >> KDIS_STREAM m_MunitionID;
        }
        else
        {
            // We cant use the standard encode/decode functions here as not all fields are included.

            // The Firing Entities site and application id are the same so lets copy them over
            m_MunitionID = m_EntID;

            stream >> tmp;
            m_MunitionID.SetEntityID( tmp );
        }
    }

    // F3: Event ID
    if( m_FireFlagUnion.m_ui8EventSiteAppId )
    {
        stream >> KDIS_STREAM m_EventID;
    }
    else
    {
        // We cant use the standard encode/decode functions here as not all fields are included.

        // The Firing Entities site and application id are the same so lets copy them over
        m_EventID = m_EntID;

        stream >> tmp;
        m_EventID.SetEntityID( tmp );
    }

    // F6: Location
    if( m_FireFlagUnion.m_ui8Location )
    {
        stream >> KDIS_STREAM m_Loc;
    }

    // Munition Descriptor
    m_MunitionDesc.SetType( EntityType( stream ) );
    // F4: Warhead and Fuse fields of the Munition Descriptor record
    if( m_FireFlagUnion.m_ui8WarheadFuse )
    {
        stream >> tmp;
        m_MunitionDesc.SetWarhead( ( WarheadType )tmp );

        stream >> tmp;
        m_MunitionDesc.SetFuse( ( FuseType )tmp );
    }
    // F5: Quantity and Rate fields of the Munition Descriptor record
    if( m_FireFlagUnion.m_ui8QuantRate )
    {
        stream >> tmp;
        m_MunitionDesc.SetQuantity( tmp );

        stream >> tmp;
        m_MunitionDesc.SetRate( tmp );
    }

    // Velocity and Range
    stream >> KDIS_STREAM m_Vel
           >> m_ui16Range;
}